

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

bool ASDCP::ATMOS::IsDolbyAtmos(string *filename)

{
  int iVar1;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [40];
  string *psStack_10;
  bool result;
  string *filename_local;
  
  psStack_10 = filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"atmos",&local_39);
  Kumu::PathGetExtension(local_70);
  iVar1 = std::__cxx11::string::compare(local_38);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return iVar1 == 0;
}

Assistant:

bool
ASDCP::ATMOS::IsDolbyAtmos(const std::string& filename)
{
    // TODO
    // For now use an atmos extension
    bool result = ( 0 == (std::string("atmos").compare(Kumu::PathGetExtension(filename))) );
    return result;
}